

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int ExportAlpha(WebPDecParams *p,int y_pos,int max_lines_out)

{
  WEBP_CSP_MODE WVar1;
  int iVar2;
  WebPDecBuffer *pWVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  WebPRescaler *wrk;
  long lVar7;
  int iVar8;
  uint8_t *puVar9;
  
  pWVar3 = p->output;
  wrk = p->scaler_a;
  lVar7 = (long)(pWVar3->u).RGBA.stride;
  puVar5 = (pWVar3->u).RGBA.rgba + y_pos * lVar7;
  WVar1 = pWVar3->colorspace;
  puVar9 = puVar5 + (ulong)(WVar1 != MODE_Argb && WVar1 != MODE_ARGB) * 3;
  iVar2 = wrk->dst_width;
  uVar6 = 0;
  for (iVar8 = 0; ((wrk->dst_y < wrk->dst_height && (wrk->y_accum < 1)) && (iVar8 < max_lines_out));
      iVar8 = iVar8 + 1) {
    WebPRescalerExportRow(wrk);
    uVar4 = (*WebPDispatchAlpha)(p->scaler_a->dst,0,iVar2,1,puVar9,0);
    uVar6 = uVar6 | uVar4;
    lVar7 = (long)(pWVar3->u).RGBA.stride;
    puVar9 = puVar9 + lVar7;
    wrk = p->scaler_a;
  }
  if ((WVar1 - MODE_rgbA < 4) && (uVar6 != 0)) {
    (*WebPApplyAlphaMultiply)
              (puVar5,(uint)(WVar1 == MODE_Argb || WVar1 == MODE_ARGB),iVar2,iVar8,(int)lVar7);
  }
  return iVar8;
}

Assistant:

static int ExportAlpha(WebPDecParams* const p, int y_pos, int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int alpha_first =
      (colorspace == MODE_ARGB || colorspace == MODE_Argb);
  uint8_t* dst = base_rgba + (alpha_first ? 0 : 3);
  int num_lines_out = 0;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t non_opaque = 0;
  const int width = p->scaler_a->dst_width;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    non_opaque |= WebPDispatchAlpha(p->scaler_a->dst, 0, width, 1, dst, 0);
    dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && non_opaque) {
    WebPApplyAlphaMultiply(base_rgba, alpha_first,
                           width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}